

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTD_overflowCorrectIfNeeded
               (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_CCtx_params *params,void *ip,void *iend)

{
  U32 *pUVar1;
  uint uVar2;
  U32 *table;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  U32 reducerValue;
  int iVar8;
  U32 UVar9;
  int iVar10;
  long lVar11;
  U32 UVar12;
  undefined1 in_XMM3 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  if (0xe0000000 < (uint)((int)iend - *(int *)&(ms->window).base)) {
    reducerValue = ZSTD_window_correctOverflow
                             (&ms->window,
                              ((params->cParams).chainLog - 1) +
                              (uint)((params->cParams).strategy < ZSTD_btlazy2),
                              1 << ((byte)(params->cParams).windowLog & 0x1f),ip);
    if (ws->tableValidEnd < ws->objectEnd) {
      __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x42cd,"void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *)");
    }
    if (ws->allocStart < ws->tableValidEnd) {
      __assert_fail("ws->tableValidEnd <= ws->allocStart",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x42ce,"void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *)");
    }
    ws->tableValidEnd = ws->objectEnd;
    ZSTD_cwksp_assert_internal_consistency(ws);
    ZSTD_reduceTable(ms->hashTable,1 << ((byte)(params->cParams).hashLog & 0x1f),reducerValue);
    iVar8 = ZSTD_allocateChainTable
                      ((params->cParams).strategy,params->useRowMatchFinder,ms->dedicatedDictSearch)
    ;
    if (iVar8 != 0) {
      uVar2 = (params->cParams).chainLog;
      UVar12 = 1 << ((byte)uVar2 & 0x1f);
      table = ms->chainTable;
      if ((params->cParams).strategy == ZSTD_btlazy2) {
        UVar9 = UVar12 + 0xf;
        if (-1 < (int)UVar12) {
          UVar9 = UVar12;
        }
        if (uVar2 < 4) {
          __assert_fail("(size & (ZSTD_ROWSIZE-1)) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x5abc,
                        "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)"
                       );
        }
        if (uVar2 == 0x1f) {
          __assert_fail("size < (1U<<31)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x5abd,
                        "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)"
                       );
        }
        if (0xf < (int)UVar12) {
          uVar2 = reducerValue + 2;
          iVar8 = 0;
          auVar13 = pmovsxbd(in_XMM3,0x1010101);
          iVar10 = 0;
          do {
            lVar11 = 0;
            do {
              pUVar1 = table + iVar8 + lVar11;
              uVar4 = *pUVar1;
              uVar5 = pUVar1[1];
              uVar6 = pUVar1[2];
              uVar7 = pUVar1[3];
              auVar15._0_4_ = -(uint)(((uVar4 < uVar2) * uVar2 | (uVar4 >= uVar2) * uVar4) == uVar4)
              ;
              auVar15._4_4_ = -(uint)(((uVar5 < uVar2) * uVar2 | (uVar5 >= uVar2) * uVar5) == uVar5)
              ;
              auVar15._8_4_ = -(uint)(((uVar6 < uVar2) * uVar2 | (uVar6 >= uVar2) * uVar6) == uVar6)
              ;
              auVar15._12_4_ =
                   -(uint)(((uVar7 < uVar2) * uVar2 | (uVar7 >= uVar2) * uVar7) == uVar7);
              auVar16._0_4_ = -(uint)(uVar4 == auVar13._0_4_);
              auVar16._4_4_ = -(uint)(uVar5 == auVar13._4_4_);
              auVar16._8_4_ = -(uint)(uVar6 == auVar13._8_4_);
              auVar16._12_4_ = -(uint)(uVar7 == auVar13._12_4_);
              auVar14._0_4_ = uVar4 - reducerValue;
              auVar14._4_4_ = uVar5 - reducerValue;
              auVar14._8_4_ = uVar6 - reducerValue;
              auVar14._12_4_ = uVar7 - reducerValue;
              auVar16 = blendvps(auVar15 & auVar14,auVar13,auVar16);
              *(undefined1 (*) [16])(table + iVar8 + lVar11) = auVar16;
              lVar11 = lVar11 + 4;
            } while (lVar11 != 0x10);
            iVar8 = iVar8 + 0x10;
            iVar10 = iVar10 + 1;
          } while (iVar10 != (int)UVar9 >> 4);
        }
      }
      else {
        ZSTD_reduceTable(table,UVar12,reducerValue);
      }
    }
    if (ms->hashLog3 != 0) {
      ZSTD_reduceTable(ms->hashTable3,1 << ((byte)ms->hashLog3 & 0x1f),reducerValue);
    }
    pvVar3 = ws->tableValidEnd;
    if (pvVar3 < ws->objectEnd) {
      __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x42d5,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
    }
    if (ws->allocStart < pvVar3) {
      __assert_fail("ws->tableValidEnd <= ws->allocStart",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x42d6,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
    }
    if (pvVar3 < ws->tableEnd) {
      ws->tableValidEnd = ws->tableEnd;
    }
    ZSTD_cwksp_assert_internal_consistency(ws);
    UVar12 = ms->nextToUpdate - reducerValue;
    if (ms->nextToUpdate < reducerValue) {
      UVar12 = 0;
    }
    ms->nextToUpdate = UVar12;
    ms->loadedDictEnd = 0;
    ms->dictMatchState = (ZSTD_matchState_t *)0x0;
  }
  return;
}

Assistant:

static void ZSTD_overflowCorrectIfNeeded(ZSTD_matchState_t* ms,
                                         ZSTD_cwksp* ws,
                                         ZSTD_CCtx_params const* params,
                                         void const* ip,
                                         void const* iend)
{
    U32 const cycleLog = ZSTD_cycleLog(params->cParams.chainLog, params->cParams.strategy);
    U32 const maxDist = (U32)1 << params->cParams.windowLog;
    if (ZSTD_window_needOverflowCorrection(ms->window, cycleLog, maxDist, ms->loadedDictEnd, ip, iend)) {
        U32 const correction = ZSTD_window_correctOverflow(&ms->window, cycleLog, maxDist, ip);
        ZSTD_STATIC_ASSERT(ZSTD_CHAINLOG_MAX <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX_32 <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX <= 31);
        ZSTD_cwksp_mark_tables_dirty(ws);
        ZSTD_reduceIndex(ms, params, correction);
        ZSTD_cwksp_mark_tables_clean(ws);
        if (ms->nextToUpdate < correction) ms->nextToUpdate = 0;
        else ms->nextToUpdate -= correction;
        /* invalidate dictionaries on overflow correction */
        ms->loadedDictEnd = 0;
        ms->dictMatchState = NULL;
    }
}